

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper1.cpp
# Opt level: O3

void cpp_wrapper_setup(planck_unit_test_t *tc,Dictionary<int,_int> *dict,
                      ion_behaviour_fill_level_e fill_level)

{
  uint uVar1;
  int iVar2;
  int key;
  
  switch(fill_level) {
  case ion_fill_edge_cases:
    uVar1 = 0xffffff9a;
    iVar2 = -300;
    do {
      uVar1 = uVar1 + 2;
      cpp_wrapper_insert(tc,dict,uVar1,iVar2,'\x01');
      iVar2 = iVar2 + 6;
    } while (uVar1 < 0xffffffcc);
  case ion_fill_high:
    uVar1 = 0x1ef;
    iVar2 = 5000;
    do {
      uVar1 = uVar1 + 5;
      cpp_wrapper_insert(tc,dict,uVar1,iVar2,'\x01');
      iVar2 = iVar2 + 0x32;
    } while (uVar1 < 0x3e3);
  case ion_fill_medium:
    uVar1 = 0x30;
    iVar2 = 0xfa;
    do {
      uVar1 = uVar1 + 2;
      cpp_wrapper_insert(tc,dict,uVar1,iVar2,'\x01');
      iVar2 = iVar2 + 10;
    } while (uVar1 < 0x62);
  case ion_fill_low:
    iVar2 = 0;
    key = 0;
    do {
      cpp_wrapper_insert(tc,dict,key,iVar2,'\x01');
      key = key + 1;
      iVar2 = iVar2 + 2;
    } while (key != 10);
    return;
  default:
    return;
  }
}

Assistant:

void
cpp_wrapper_setup(
	planck_unit_test_t *tc,
	Dictionary<int, int>			*dict,
	ion_behaviour_fill_level_e fill_level
) {
	/* This switch statement intentionally doesn't have breaks - we want it to fall through. */
	int i;

	switch (fill_level) {
		case ion_fill_edge_cases: {
			ION_FILL_EDGE_LOOP(i) {
				cpp_wrapper_insert(tc, dict, i, i * 3, boolean_true);
			}
		}

		case ion_fill_high: {
			ION_FILL_HIGH_LOOP(i) {
				cpp_wrapper_insert(tc, dict, i, i * 10, boolean_true);
			}
		}

		case ion_fill_medium: {
			ION_FILL_MEDIUM_LOOP(i) {
				cpp_wrapper_insert(tc, dict, i, i * 5, boolean_true);
			}
		}

		case ion_fill_low: {
			ION_FILL_LOW_LOOP(i) {
				cpp_wrapper_insert(tc, dict, i, i * 2, boolean_true);
			}
		}

		case ion_fill_none: {
			/* Intentionally left blank */
		}
	}
}